

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<int,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  undefined8 *puVar1;
  tag_t<cfgfile::qstring_trait_t> *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  logic_error *plVar6;
  undefined8 *puVar7;
  string local_248;
  string local_228;
  qstring_wrapper_t local_208;
  qstring_wrapper_t local_1e8;
  string_t local_1c8;
  string_t local_1b0;
  qstring_wrapper_t local_198;
  qstring_wrapper_t local_180;
  qstring_wrapper_t local_168;
  qstring_wrapper_t local_150;
  qstring_wrapper_t local_138;
  qstring_wrapper_t local_120;
  qstring_wrapper_t local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string_t local_90;
  string_t local_78;
  string_t local_60;
  string_t local_48;
  
  if ((this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined == false) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x28);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Undefined value of tag: \"","");
    qstring_trait_t::from_ascii(&local_168,&local_248);
    operator+(&local_150,&local_168,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\". In file \"","");
    qstring_trait_t::from_ascii(&local_180,&local_b0);
    operator+(&local_138,&local_150,&local_180);
    operator+(&local_120,&local_138,&info->m_file_name);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\" on line ","");
    qstring_trait_t::from_ascii(&local_198,&local_d0);
    operator+(&local_108,&local_120,&local_198);
    qstring_trait_t::to_string(&local_1b0,info->m_line_number);
    operator+((qstring_wrapper_t *)&local_f0,&local_108,&local_1b0);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,".","");
    qstring_trait_t::from_ascii(&local_1c8,&local_228);
    operator+(&local_1e8,(qstring_wrapper_t *)&local_f0,&local_1c8);
    std::logic_error::logic_error(plVar6,"Please use desc() method of the exception.");
    *(undefined ***)plVar6 = &PTR__exception_t_00121a28;
    *(undefined8 *)(plVar6 + 0x20) = 0;
    uVar2 = local_1e8.m_str.d.d._0_4_;
    uVar3 = local_1e8.m_str.d.d._4_4_;
    local_1e8.m_str.d.d = (Data *)0x0;
    *(undefined4 *)(plVar6 + 0x10) = uVar2;
    *(undefined4 *)(plVar6 + 0x14) = uVar3;
    *(undefined4 *)(plVar6 + 0x18) = local_1e8.m_str.d.ptr._0_4_;
    *(undefined4 *)(plVar6 + 0x1c) = local_1e8.m_str.d.ptr._4_4_;
    local_1e8.m_str.d.ptr = (char16_t *)0x0;
    *(qsizetype *)(plVar6 + 0x20) = local_1e8.m_str.d.size;
    local_1e8.m_str.d.size = 0;
    __cxa_throw(plVar6,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  iVar5 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
  puVar7 = *(undefined8 **)CONCAT44(extraout_var,iVar5);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar5))[1];
  do {
    if (puVar7 == puVar1) {
      return;
    }
    this_00 = (tag_t<cfgfile::qstring_trait_t> *)*puVar7;
    if (this_00->m_is_mandatory == true) {
      bVar4 = tag_t<cfgfile::qstring_trait_t>::is_defined(this_00);
      if (!bVar4) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x28);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"Undefined child mandatory tag: \"","");
        qstring_trait_t::from_ascii(&local_1b0,&local_248);
        operator+(&local_198,&local_1b0,&this_00->m_name);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"\". Where parent is: \"","");
        qstring_trait_t::from_ascii(&local_1c8,&local_b0);
        operator+(&local_180,&local_198,&local_1c8);
        operator+(&local_168,&local_180,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\". In file \"","");
        qstring_trait_t::from_ascii(&local_48,&local_d0);
        operator+(&local_150,&local_168,&local_48);
        operator+(&local_138,&local_150,&info->m_file_name);
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\" on line ","");
        qstring_trait_t::from_ascii(&local_60,&local_228);
        operator+(&local_120,&local_138,&local_60);
        qstring_trait_t::to_string(&local_78,info->m_line_number);
        operator+(&local_108,&local_120,&local_78);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".","");
        qstring_trait_t::from_ascii(&local_90,&local_f0);
        operator+(&local_208,&local_108,&local_90);
        std::logic_error::logic_error(plVar6,"Please use desc() method of the exception.");
        *(undefined ***)plVar6 = &PTR__exception_t_00121a28;
        *(undefined8 *)(plVar6 + 0x20) = 0;
        uVar2 = local_208.m_str.d.d._0_4_;
        uVar3 = local_208.m_str.d.d._4_4_;
        local_208.m_str.d.d = (Data *)0x0;
        *(undefined4 *)(plVar6 + 0x10) = uVar2;
        *(undefined4 *)(plVar6 + 0x14) = uVar3;
        *(undefined4 *)(plVar6 + 0x18) = local_208.m_str.d.ptr._0_4_;
        *(undefined4 *)(plVar6 + 0x1c) = local_208.m_str.d.ptr._4_4_;
        local_208.m_str.d.ptr = (char16_t *)0x0;
        *(qsizetype *)(plVar6 + 0x20) = local_208.m_str.d.size;
        local_208.m_str.d.size = 0;
        __cxa_throw(plVar6,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}